

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O0

uint64_t lj_carith_check64(lua_State *L,int narg,CTypeID *id)

{
  int iVar1;
  uint64_t uStack_150;
  int32_t i;
  uint64_t x;
  CType *s;
  uint8_t *puStack_138;
  CTypeID sid;
  uint8_t *sp;
  CTState *cts;
  TValue *o;
  CTypeID *id_local;
  lua_State *plStack_110;
  int narg_local;
  lua_State *L_local;
  CTState *local_100;
  CTState *cts_1;
  uint local_ec;
  CTState *local_e8;
  uint local_dc;
  CTState *local_d8;
  CType *local_d0;
  CType *ct;
  CTState *local_c0;
  uint local_b4;
  CTState *local_b0;
  CType *local_a8;
  CTState *local_a0;
  uint local_94;
  CTState *local_90;
  CType *local_88;
  CTState *local_80;
  uint local_74;
  CTState *local_70;
  TValue o_1;
  uint local_54;
  CTState *local_50;
  uint local_44;
  CTState *local_40;
  uint local_34;
  CTState *local_30;
  uint local_24;
  CTState *local_20;
  uint local_14;
  CTState *local_10;
  
  cts = (CTState *)(L->base + (long)narg + -1);
  o = (TValue *)id;
  id_local._4_4_ = narg;
  plStack_110 = L;
  if (cts < L->top) {
    if (0xfffffff2 < (uint)((int)(*(anon_struct_8_2_7fa0a05d_for_TValue_4 *)cts).it >> 0xf)) {
      if ((int)(*(anon_struct_8_2_7fa0a05d_for_TValue_4 *)cts).it >> 0xf == -0xb) {
        sp = *(uint8_t **)((L->glref).ptr64 + 0x180);
        ((CTState *)sp)->L = L;
        puStack_138 = (uint8_t *)((*(ulong *)cts & 0x7fffffffffff) + 0x10);
        local_dc = (uint)*(ushort *)((*(ulong *)cts & 0x7fffffffffff) + 10);
        s._4_4_ = local_dc;
        if ((((CTState *)sp)->tab[local_dc].info & 0xf0800000) == 0x20800000) {
          puStack_138 = *(uint8_t **)puStack_138;
          s._4_4_ = ((CTState *)sp)->tab[local_dc].info & 0xffff;
        }
        ct._4_4_ = s._4_4_;
        local_b4 = s._4_4_;
        local_34 = s._4_4_;
        local_d0 = ((CTState *)sp)->tab + s._4_4_;
        while (local_d0->info >> 0x1c == 8) {
          local_a8 = local_d0;
          local_94 = local_d0->info & 0xffff;
          local_a0 = (CTState *)sp;
          local_90 = (CTState *)sp;
          local_44 = local_94;
          local_40 = (CTState *)sp;
          local_d0 = ((CTState *)sp)->tab + local_94;
        }
        x = (uint64_t)local_d0;
        if (local_d0->info >> 0x1c == 5) {
          local_88 = local_d0;
          local_74 = local_d0->info & 0xffff;
          x = (uint64_t)(((CTState *)sp)->tab + local_74);
          local_80 = (CTState *)sp;
          local_70 = (CTState *)sp;
          local_54 = local_74;
          local_50 = (CTState *)sp;
        }
        if (((*(uint *)x & 0xfc800000) == 0x800000) && (*(int *)(x + 4) == 8)) {
          *id = 0xc;
        }
        else if (*id == 0) {
          *id = 0xb;
        }
        local_ec = *id;
        local_100 = (CTState *)sp;
        cts_1 = (CTState *)L;
        local_e8 = (CTState *)sp;
        local_d8 = (CTState *)sp;
        local_c0 = (CTState *)sp;
        local_b0 = (CTState *)sp;
        local_30 = (CTState *)sp;
        local_24 = local_dc;
        local_20 = (CTState *)sp;
        local_14 = local_ec;
        local_10 = (CTState *)sp;
        lj_cconv_ct_ct((CTState *)sp,((CTState *)sp)->tab + local_ec,(CType *)x,
                       (uint8_t *)&stack0xfffffffffffffeb0,puStack_138,narg << 8);
        return uStack_150;
      }
      if (((int)(*(anon_struct_8_2_7fa0a05d_for_TValue_4 *)cts).it >> 0xf != -5) ||
         (iVar1 = lj_strscan_num((GCstr *)(*(ulong *)cts & 0x7fffffffffff),(TValue *)cts),
         iVar1 == 0)) goto LAB_00178469;
    }
    return (ulong)((double)cts->tab + 6755399441055744.0) & 0xffffffff;
  }
LAB_00178469:
  lj_err_argt(plStack_110,id_local._4_4_,3);
}

Assistant:

uint64_t lj_carith_check64(lua_State *L, int narg, CTypeID *id)
{
  TValue *o = L->base + narg-1;
  if (o >= L->top) {
  err:
    lj_err_argt(L, narg, LUA_TNUMBER);
  } else if (LJ_LIKELY(tvisnumber(o))) {
    /* Handled below. */
  } else if (tviscdata(o)) {
    CTState *cts = ctype_cts(L);
    uint8_t *sp = (uint8_t *)cdataptr(cdataV(o));
    CTypeID sid = cdataV(o)->ctypeid;
    CType *s = ctype_get(cts, sid);
    uint64_t x;
    if (ctype_isref(s->info)) {
      sp = *(void **)sp;
      sid = ctype_cid(s->info);
    }
    s = ctype_raw(cts, sid);
    if (ctype_isenum(s->info)) s = ctype_child(cts, s);
    if ((s->info & (CTMASK_NUM|CTF_BOOL|CTF_FP|CTF_UNSIGNED)) ==
	CTINFO(CT_NUM, CTF_UNSIGNED) && s->size == 8)
      *id = CTID_UINT64;  /* Use uint64_t, since it has the highest rank. */
    else if (!*id)
      *id = CTID_INT64;  /* Use int64_t, unless already set. */
    lj_cconv_ct_ct(cts, ctype_get(cts, *id), s,
		   (uint8_t *)&x, sp, CCF_ARG(narg));
    return x;
  } else if (!(tvisstr(o) && lj_strscan_number(strV(o), o))) {
    goto err;
  }
  if (LJ_LIKELY(tvisint(o))) {
    return (uint32_t)intV(o);
  } else {
    int32_t i = lj_num2bit(numV(o));
    if (LJ_DUALNUM) setintV(o, i);
    return (uint32_t)i;
  }
}